

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_optional_asn1(CBS *cbs,CBS *out,int *out_present,CBS_ASN1_TAG tag)

{
  int iVar1;
  int local_30;
  int present;
  CBS_ASN1_TAG tag_local;
  int *out_present_local;
  CBS *out_local;
  CBS *cbs_local;
  
  local_30 = 0;
  iVar1 = CBS_peek_asn1_tag(cbs,tag);
  if (iVar1 != 0) {
    iVar1 = CBS_get_asn1(cbs,out,tag);
    if (iVar1 == 0) {
      return 0;
    }
    local_30 = 1;
  }
  if (out_present != (int *)0x0) {
    *out_present = local_30;
  }
  return 1;
}

Assistant:

int CBS_get_optional_asn1(CBS *cbs, CBS *out, int *out_present,
                          CBS_ASN1_TAG tag) {
  int present = 0;

  if (CBS_peek_asn1_tag(cbs, tag)) {
    if (!CBS_get_asn1(cbs, out, tag)) {
      return 0;
    }
    present = 1;
  }

  if (out_present != NULL) {
    *out_present = present;
  }

  return 1;
}